

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O3

int ERKStepPrintAllStats(void *arkode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  int iVar1;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeERKStepMem local_30;
  ARKodeMem local_28;
  
  iVar1 = erkStep_AccessStepMem(arkode_mem,"ERKStepPrintAllStats",&local_28,&local_30);
  if ((iVar1 == 0) && (iVar1 = arkPrintAllStats(arkode_mem,outfile,fmt), iVar1 == 0)) {
    if (fmt == SUN_OUTPUTFORMAT_CSV) {
      iVar1 = 0;
      fprintf((FILE *)outfile,",RHS fn evals,%ld",local_30->nfe);
      fputc(10,(FILE *)outfile);
    }
    else if (fmt == SUN_OUTPUTFORMAT_TABLE) {
      iVar1 = 0;
      fprintf((FILE *)outfile,"RHS fn evals                 = %ld\n",local_30->nfe);
    }
    else {
      iVar1 = -0x16;
      arkProcessError(local_28,-0x16,"ARKode","ERKStepPrintAllStats","Invalid formatting option.");
    }
  }
  return iVar1;
}

Assistant:

int ERKStepPrintAllStats(void *arkode_mem, FILE *outfile, SUNOutputFormat fmt)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepPrintAllStats",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  retval = arkPrintAllStats(arkode_mem, outfile, fmt);
  if (retval != ARK_SUCCESS) return(retval);

  switch(fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    fprintf(outfile, "RHS fn evals                 = %ld\n", step_mem->nfe);
    break;
  case SUN_OUTPUTFORMAT_CSV:
    fprintf(outfile, ",RHS fn evals,%ld", step_mem->nfe);
    fprintf(outfile, "\n");
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "ERKStepPrintAllStats",
                    "Invalid formatting option.");
    return(ARK_ILL_INPUT);
  }

  return(ARK_SUCCESS);
}